

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O2

int matchNonSingletonOutputs
              (Abc_Ntk_t *pNtk1,Vec_Ptr_t **nodesInLevel1,Vec_Int_t **iMatch1,Vec_Int_t **iDep1,
              Vec_Int_t *matchedInputs1,int *iGroup1,Vec_Int_t **oMatch1,int *oGroup1,
              Abc_Ntk_t *pNtk2,Vec_Ptr_t **nodesInLevel2,Vec_Int_t **iMatch2,Vec_Int_t **iDep2,
              Vec_Int_t *matchedInputs2,int *iGroup2,Vec_Int_t **oMatch2,int *oGroup2,
              Vec_Int_t *matchedOutputs1,Vec_Int_t *matchedOutputs2,Vec_Int_t *oMatchedGroups,
              Vec_Int_t *iNonSingleton,Abc_Ntk_t *subNtk1,Abc_Ntk_t *subNtk2,Vec_Ptr_t *oMatchPairs,
              Vec_Int_t *oNonSingleton,int oI,int idx,int ii,int iidx)

{
  uint uVar1;
  Vec_Int_t *p;
  int iVar2;
  int iVar3;
  int Entry;
  int iVar4;
  int iVar5;
  Vec_Int_t *mismatch;
  void *__ptr;
  ulong uVar6;
  Abc_Obj_t *pAVar7;
  void *__ptr_00;
  int *pModel;
  int *__ptr_01;
  int *__ptr_02;
  ulong uVar8;
  byte bVar9;
  long lVar10;
  long lVar11;
  
  matchNonSingletonOutputs_MATCH_FOUND = 0;
  if (oNonSingleton->nSize == oI) {
    if ((iNonSingleton == (Vec_Int_t *)0x0) ||
       (iVar2 = match1by1(pNtk1,nodesInLevel1,iMatch1,iDep1,matchedInputs1,iGroup1,oMatch1,oGroup1,
                          pNtk2,nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,oMatch2,oGroup2,
                          matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,ii,iidx),
       bVar9 = matchNonSingletonOutputs_MATCH_FOUND, iVar2 != 0)) {
      matchNonSingletonOutputs_MATCH_FOUND = 1;
      bVar9 = 1;
    }
  }
  else {
    iVar2 = Vec_IntEntry(oNonSingleton,oI);
    mismatch = Vec_IntAlloc(10);
    p = oMatch1[iVar2];
    uVar1 = p->nSize;
    __ptr = malloc((long)(int)uVar1 << 2);
    uVar6 = 0;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      *(undefined4 *)((long)__ptr + uVar6 * 4) = 0;
    }
    iVar3 = Vec_IntEntry(p,idx);
    pAVar7 = Abc_NtkPo(subNtk1,iVar3);
    Vec_PtrPush(oMatchPairs,pAVar7);
    iVar3 = Vec_IntEntry(oMatch1[iVar2],idx);
    Vec_IntPush(matchedOutputs1,iVar3);
    lVar11 = 0;
    while ((lVar11 < oMatch2[iVar2]->nSize && ((matchNonSingletonOutputs_MATCH_FOUND & 1) == 0))) {
      iVar4 = (int)lVar11;
      iVar3 = Vec_IntEntry(oMatch2[iVar2],iVar4);
      if ((iVar3 != -1) && (*(int *)((long)__ptr + lVar11 * 4) != 1)) {
        iVar3 = Vec_IntEntry(oMatch2[iVar2],iVar4);
        pAVar7 = Abc_NtkPo(subNtk2,iVar3);
        Vec_PtrPush(oMatchPairs,pAVar7);
        iVar3 = Vec_IntEntry(oMatch2[iVar2],iVar4);
        Vec_IntPush(matchedOutputs2,iVar3);
        matchNonSingletonOutputs::counter = matchNonSingletonOutputs::counter + 1;
        iVar3 = Abc_NtkBmSat(subNtk1,subNtk2,(Vec_Ptr_t *)0x0,oMatchPairs,mismatch,0);
        if (iVar3 == 0) {
          uVar1 = subNtk1->vPis->nSize;
          __ptr_00 = malloc((long)(int)uVar1 + 1);
          *(undefined1 *)((long)__ptr_00 + (long)(int)uVar1) = 0;
          uVar6 = 0;
          if (0 < (int)uVar1) {
            uVar6 = (ulong)uVar1;
          }
          for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
            *(undefined1 *)((long)__ptr_00 + uVar8) = 0x30;
          }
          for (iVar3 = 0; iVar3 < mismatch->nSize; iVar3 = iVar3 + 2) {
            iVar4 = Vec_IntEntry(mismatch,iVar3 + 1);
            iVar5 = Vec_IntEntry(mismatch,iVar3);
            *(char *)((long)__ptr_00 + (long)iVar5) = (char)iVar4;
          }
          pModel = (int *)malloc((long)subNtk1->vCis->nSize << 2);
          for (lVar10 = 0; lVar10 < subNtk1->vPis->nSize; lVar10 = lVar10 + 1) {
            Abc_NtkPi(subNtk1,(int)lVar10);
            pModel[lVar10] = *(char *)((long)__ptr_00 + lVar10) + -0x30;
          }
          for (lVar10 = 0; (int)lVar10 < subNtk1->vBoxes->nSize; lVar10 = lVar10 + 1) {
            pAVar7 = Abc_NtkBox(subNtk1,(int)lVar10);
            if ((*(uint *)&pAVar7->field_0x14 & 0xf) == 8) {
              pModel[subNtk1->vPis->nSize + lVar10] = (pAVar7->field_5).iData + -1;
            }
          }
          __ptr_01 = Abc_NtkVerifySimulatePattern(subNtk1,pModel);
          for (lVar10 = 0; (int)lVar10 < subNtk2->vBoxes->nSize; lVar10 = lVar10 + 1) {
            pAVar7 = Abc_NtkBox(subNtk2,(int)lVar10);
            if ((*(uint *)&pAVar7->field_0x14 & 0xf) == 8) {
              pModel[subNtk2->vPis->nSize + lVar10] = (pAVar7->field_5).iData + -1;
            }
          }
          __ptr_02 = Abc_NtkVerifySimulatePattern(subNtk2,pModel);
          for (lVar10 = 0; lVar10 < oMatch1[iVar2]->nSize; lVar10 = lVar10 + 1) {
            iVar3 = Vec_IntEntry(oMatch1[iVar2],idx);
            iVar3 = __ptr_01[iVar3];
            iVar4 = Vec_IntEntry(oMatch2[iVar2],(int)lVar10);
            if (iVar3 != __ptr_02[iVar4]) {
              *(undefined4 *)((long)__ptr + lVar10 * 4) = 1;
            }
          }
          free(__ptr_00);
          free(pModel);
          free(__ptr_01);
          free(__ptr_02);
        }
        else {
          Entry = Vec_IntEntry(oMatch2[iVar2],iVar4);
          Vec_IntWriteEntry(oMatch2[iVar2],iVar4,-1);
          iVar3 = idx + 1;
          iVar5 = oI;
          if (oMatch1[iVar2]->nSize + -1 == idx) {
            iVar3 = 0;
            iVar5 = oI + 1;
          }
          matchNonSingletonOutputs
                    (pNtk1,nodesInLevel1,iMatch1,iDep1,matchedInputs1,iGroup1,oMatch1,oGroup1,pNtk2,
                     nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,oMatch2,oGroup2,
                     matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,subNtk1,subNtk2,
                     oMatchPairs,oNonSingleton,iVar5,iVar3,ii,iidx);
          Vec_IntWriteEntry(oMatch2[iVar2],iVar4,Entry);
        }
        if (matchNonSingletonOutputs_MATCH_FOUND == 0) {
          Vec_PtrPop(oMatchPairs);
          Vec_IntPop(matchedOutputs2);
        }
      }
      lVar11 = lVar11 + 1;
    }
    bVar9 = 1;
    if ((matchNonSingletonOutputs_MATCH_FOUND & 1) == 0) {
      Vec_PtrPop(oMatchPairs);
      Vec_IntPop(matchedOutputs1);
      bVar9 = matchNonSingletonOutputs_MATCH_FOUND;
    }
    if (((bVar9 & 1) != 0) && (matchNonSingletonOutputs::counter != 0)) {
      matchNonSingletonOutputs::counter = 0;
    }
    free(mismatch);
    free(__ptr);
  }
  return bVar9 & 1;
}

Assistant:

int matchNonSingletonOutputs(Abc_Ntk_t * pNtk1, Vec_Ptr_t ** nodesInLevel1, Vec_Int_t ** iMatch1, Vec_Int_t ** iDep1, Vec_Int_t * matchedInputs1, int * iGroup1, Vec_Int_t ** oMatch1, int * oGroup1,
                              Abc_Ntk_t * pNtk2, Vec_Ptr_t ** nodesInLevel2, Vec_Int_t ** iMatch2, Vec_Int_t ** iDep2, Vec_Int_t * matchedInputs2, int * iGroup2, Vec_Int_t ** oMatch2, int * oGroup2,
                              Vec_Int_t * matchedOutputs1, Vec_Int_t * matchedOutputs2, Vec_Int_t * oMatchedGroups, Vec_Int_t * iNonSingleton,                         
                              Abc_Ntk_t * subNtk1, Abc_Ntk_t * subNtk2, Vec_Ptr_t * oMatchPairs,
                              Vec_Int_t * oNonSingleton, int oI, int idx, int ii, int iidx)
{        
    static int MATCH_FOUND;
    int i;
    int j, temp;
    Vec_Int_t * mismatch;        
    int * skipList;    
    static int counter = 0;

    MATCH_FOUND = FALSE;
    
    if( oI == Vec_IntSize( oNonSingleton ) )
    {
        if( iNonSingleton != NULL)            
            if( match1by1(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                          pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                           matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton, ii, iidx) )
                MATCH_FOUND = TRUE;    

        if( iNonSingleton == NULL)
            MATCH_FOUND = TRUE;

        return MATCH_FOUND;
    }

    i = Vec_IntEntry(oNonSingleton, oI);

    mismatch = Vec_IntAlloc(10);
    
    skipList = ABC_ALLOC(int, Vec_IntSize(oMatch1[i]));

    for(j = 0; j < Vec_IntSize(oMatch1[i]); j++)
        skipList[j] = FALSE;

    Vec_PtrPush(oMatchPairs, Abc_NtkPo(subNtk1, Vec_IntEntry(oMatch1[i], idx)) );
    Vec_IntPush(matchedOutputs1, Vec_IntEntry(oMatch1[i], idx));

    for(j = 0; j < Vec_IntSize( oMatch2[i] ) && MATCH_FOUND == FALSE; j++)
    {
        if( Vec_IntEntry(oMatch2[i], j) == -1 || skipList[j] == TRUE)
            continue;

        Vec_PtrPush(oMatchPairs, Abc_NtkPo(subNtk2, Vec_IntEntry(oMatch2[i], j)));
        Vec_IntPush(matchedOutputs2, Vec_IntEntry(oMatch2[i], j));

        counter++;        
        if( Abc_NtkBmSat( subNtk1, subNtk2, NULL, oMatchPairs, mismatch, 0) )
        {
            /*fprintf(matchFile, "%s matched to %s\n", Abc_ObjName(Abc_NtkPo(pNtk1, Vec_IntEntry(oMatch1[i], idx))), 
                                         Abc_ObjName(Abc_NtkPo(pNtk2, Vec_IntEntry(oMatch2[i], j))));            */

            temp =  Vec_IntEntry(oMatch2[i], j);
            Vec_IntWriteEntry(oMatch2[i], j, -1);
            
            if(idx != Vec_IntSize( oMatch1[i] ) - 1)
                // call the same function with idx+1
                matchNonSingletonOutputs(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                                         pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                                         matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton,                         
                                         subNtk1, subNtk2, oMatchPairs,
                                         oNonSingleton, oI, idx+1, ii, iidx);
            else    
                // call the same function with idx = 0 and oI++
                matchNonSingletonOutputs(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                                         pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                                         matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton,                         
                                         subNtk1, subNtk2, oMatchPairs,
                                         oNonSingleton, oI+1, 0, ii, iidx);

            Vec_IntWriteEntry(oMatch2[i], j, temp);
        }        
        else
        {
            int * output1, * output2;
            int k;
            Abc_Obj_t * pObj;
            int * pModel;
            char * vPiValues;            
            

            vPiValues = ABC_ALLOC( char,  Abc_NtkPiNum(subNtk1) + 1);
            vPiValues[Abc_NtkPiNum(subNtk1)] = '\0';    
            
            for(k = 0; k < Abc_NtkPiNum(subNtk1); k++)
                vPiValues[k] = '0';

            for(k = 0; k < Vec_IntSize(mismatch); k += 2)            
                vPiValues[Vec_IntEntry(mismatch, k)] = Vec_IntEntry(mismatch, k+1);                        

            pModel = ABC_ALLOC( int, Abc_NtkCiNum(subNtk1) );    

            Abc_NtkForEachPi( subNtk1, pObj, k )
                pModel[k] = vPiValues[k] - '0';
            Abc_NtkForEachLatch( subNtk1, pObj, k )
                pModel[Abc_NtkPiNum(subNtk1)+k] = pObj->iData - 1;            
    
            output1 = Abc_NtkVerifySimulatePattern( subNtk1, pModel );

            Abc_NtkForEachLatch( subNtk2, pObj, k )
                pModel[Abc_NtkPiNum(subNtk2)+k] = pObj->iData - 1;

            output2 = Abc_NtkVerifySimulatePattern( subNtk2, pModel );
            

            for(k = 0; k < Vec_IntSize( oMatch1[i] ); k++)
                if(output1[Vec_IntEntry(oMatch1[i], idx)] != output2[Vec_IntEntry(oMatch2[i], k)])
                {
                    skipList[k] = TRUE;    
                    /*printf("Output is SKIPPED");*/
                }
                
            ABC_FREE( vPiValues );
            ABC_FREE( pModel );
            ABC_FREE( output1 );
            ABC_FREE( output2 );
        }
        
        if(MATCH_FOUND == FALSE )
        {
            Vec_PtrPop(oMatchPairs);
            Vec_IntPop(matchedOutputs2);
        }
    }

    if(MATCH_FOUND == FALSE )
    {
        Vec_PtrPop(oMatchPairs);
        Vec_IntPop(matchedOutputs1);
    }

    if(MATCH_FOUND && counter != 0)
    {        
        /*printf("Number of OUTPUT SAT instances = %d", counter);*/
        counter = 0;
    }

    ABC_FREE( mismatch );
    ABC_FREE( skipList );

    return MATCH_FOUND;
}